

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  ostream *poVar9;
  size_type sVar10;
  reference pvVar11;
  pointer pCVar12;
  char *local_a88;
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_800;
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_7f8;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_7f0;
  const_iterator i_1;
  char *sep;
  string consideredVersions;
  string consideredConfigFiles;
  string consideredVersionsVar;
  string consideredConfigsVar;
  string fileVar;
  undefined1 local_720 [8];
  ostringstream aw_1;
  string local_5a8;
  string local_588 [32];
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  string local_4d0;
  string local_4b0 [8];
  string requestedVersionString;
  __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
  local_488;
  const_iterator i;
  const_iterator duplicate_end;
  ostringstream aw;
  undefined1 local_300 [8];
  ostringstream e;
  string local_180 [5];
  bool configFileSetFOUNDFalse;
  bool found;
  bool result;
  string notFoundMessage;
  string notFoundMessageVar;
  string foundVar;
  string local_118;
  undefined1 local_f8 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_91;
  undefined1 local_90 [8];
  string dir;
  char *pcStack_68;
  bool fileFound;
  char *def;
  undefined1 local_50 [8];
  string upperFound;
  string upperDir;
  cmFindPackageCommand *this_local;
  
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::clear(&this->ConsideredConfigs);
  cmsys::SystemTools::UpperCase((string *)((long)&upperFound.field_2 + 8),&this->Name);
  cmsys::SystemTools::UpperCase((string *)local_50,&this->Name);
  std::__cxx11::string::operator+=((string *)(upperFound.field_2._M_local_buf + 8),"_DIR");
  std::__cxx11::string::operator+=((string *)local_50,"_FOUND");
  pcStack_68 = cmMakefile::GetDefinition
                         ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
  dir.field_2._M_local_buf[0xf] = '\0';
  if ((this->UseConfigFiles & 1U) != 0) {
    bVar2 = cmSystemTools::IsOff(pcStack_68);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_90,pcStack_68,&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_90);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar7);
      if (!bVar2) {
        std::operator+(&local_b8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        pcVar7 = cmMakefile::GetCurrentSourceDirectory
                           ((this->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&file.field_2 + 8),pcVar7,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=
                  ((string *)local_90,(string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)local_f8);
      bVar2 = FindConfigFile(this,(string *)local_90,(string *)local_f8);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->FileFound,(string *)local_f8);
        dir.field_2._M_local_buf[0xf] = '\x01';
      }
      pcStack_68 = cmMakefile::GetDefinition
                             ((this->super_cmFindCommon).super_cmCommand.Makefile,&this->Variable);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)local_90);
    }
    bVar2 = cmSystemTools::IsOff(pcStack_68);
    if ((bVar2) || ((dir.field_2._M_local_buf[0xf] & 1U) == 0)) {
      dir.field_2._M_local_buf[0xf] = FindConfig(this);
    }
    if (((dir.field_2._M_local_buf[0xf] & 1U) != 0) &&
       (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"fileFound is true but FileFound is empty!",
                 (allocator *)(foundVar.field_2._M_local_buf + 0xf));
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)(foundVar.field_2._M_local_buf + 0xf));
      dir.field_2._M_local_buf[0xf] = '\0';
    }
  }
  std::__cxx11::string::string
            ((string *)(notFoundMessageVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)(notFoundMessageVar.field_2._M_local_buf + 8),"_FOUND")
  ;
  std::__cxx11::string::string
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(notFoundMessage.field_2._M_local_buf + 8),"_NOT_FOUND_MESSAGE");
  std::__cxx11::string::string(local_180);
  bVar2 = true;
  bVar6 = false;
  bVar4 = false;
  if ((dir.field_2._M_local_buf[0xf] & 1U) != 0) {
    bVar3 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,
                       (string *)((long)&notFoundMessageVar.field_2 + 8));
    if ((bVar3) &&
       (bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                 (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar3)) {
      cmMakefile::RemoveDefinition
                ((this->super_cmFindCommon).super_cmCommand.Makefile,
                 (string *)((long)&notFoundMessageVar.field_2 + 8));
    }
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&notFoundMessage.field_2 + 8));
    StoreVersionFound(this);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = ReadListFile(this,pcVar7,DoPolicyScope);
    if (bVar3) {
      bVar6 = true;
      bVar3 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,
                         (string *)((long)&notFoundMessageVar.field_2 + 8));
      if ((bVar3) &&
         (bVar3 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,
                                   (string *)((long)&notFoundMessageVar.field_2 + 8)), !bVar3)) {
        bVar6 = false;
        bVar4 = true;
        pcVar7 = cmMakefile::GetSafeDefinition
                           ((this->super_cmFindCommon).super_cmCommand.Makefile,
                            (string *)((long)&notFoundMessage.field_2 + 8));
        std::__cxx11::string::operator=(local_180,pcVar7);
      }
    }
    else {
      bVar2 = false;
    }
  }
  if ((bVar2 != false) && (!bVar6)) {
    if (((this->Required & 1U) == 0) &&
       (((this->Quiet & 1U) != 0 ||
        ((((this->UseConfigFiles & 1U) != 0 && ((this->UseFindModules & 1U) == 0)) &&
         (bVar3 = std::
                  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                  ::empty(&this->ConsideredConfigs), bVar3)))))) {
      if ((this->Quiet & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        poVar9 = std::operator<<((ostream *)local_720,"Could NOT find ");
        poVar9 = std::operator<<(poVar9,(string *)&this->Name);
        poVar9 = std::operator<<(poVar9," (missing: ");
        poVar9 = std::operator<<(poVar9,(string *)&this->Name);
        std::operator<<(poVar9,"_DIR)");
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmMakefile::DisplayStatus(pcVar1,pcVar7,-1.0);
        std::__cxx11::string::~string((string *)(fileVar.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&duplicate_end);
      if (bVar4) {
        poVar9 = std::operator<<((ostream *)local_300,"Found package configuration file:\n  ");
        poVar9 = std::operator<<(poVar9,(string *)&this->FileFound);
        poVar9 = std::operator<<(poVar9,"\nbut it set ");
        poVar9 = std::operator<<(poVar9,(string *)(notFoundMessageVar.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," to FALSE so package \"");
        poVar9 = std::operator<<(poVar9,(string *)&this->Name);
        std::operator<<(poVar9,"\" is considered to be NOT FOUND.");
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          poVar9 = std::operator<<((ostream *)local_300," Reason given by package: \n");
          poVar9 = std::operator<<(poVar9,local_180);
          std::operator<<(poVar9,"\n");
        }
      }
      else {
        bVar4 = std::
                vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                ::empty(&this->ConsideredConfigs);
        if (bVar4) {
          std::__cxx11::string::string(local_4b0);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator=(local_4b0," (requested version ");
            std::__cxx11::string::operator+=(local_4b0,(string *)&this->Version);
            std::__cxx11::string::operator+=(local_4b0,")");
          }
          if ((this->UseConfigFiles & 1U) == 0) {
            poVar9 = std::operator<<((ostream *)local_300,"No \"Find");
            poVar9 = std::operator<<(poVar9,(string *)&this->Name);
            poVar9 = std::operator<<(poVar9,".cmake\" found in ");
            std::operator<<(poVar9,"CMAKE_MODULE_PATH.");
            poVar9 = std::operator<<((ostream *)&duplicate_end,"Find");
            poVar9 = std::operator<<(poVar9,(string *)&this->Name);
            poVar9 = std::operator<<(poVar9,
                                     ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                                    );
            poVar9 = std::operator<<(poVar9,(string *)&this->Name);
            std::operator<<(poVar9,
                            ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
                           );
          }
          else {
            if ((this->UseFindModules & 1U) != 0) {
              poVar9 = std::operator<<((ostream *)local_300,"By not providing \"Find");
              poVar9 = std::operator<<(poVar9,(string *)&this->Name);
              poVar9 = std::operator<<(poVar9,
                                       ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                                      );
              poVar9 = std::operator<<(poVar9,(string *)&this->Name);
              std::operator<<(poVar9,"\", but CMake did not find one.\n");
            }
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&this->Configs);
            if (sVar10 == 1) {
              poVar9 = std::operator<<((ostream *)local_300,
                                       "Could not find a package configuration file named \"");
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&this->Configs,0);
              poVar9 = std::operator<<(poVar9,(string *)pvVar11);
              poVar9 = std::operator<<(poVar9,"\" provided by package \"");
              poVar9 = std::operator<<(poVar9,(string *)&this->Name);
              poVar9 = std::operator<<(poVar9,"\"");
              poVar9 = std::operator<<(poVar9,local_4b0);
              std::operator<<(poVar9,".\n");
            }
            else {
              poVar9 = std::operator<<((ostream *)local_300,
                                       "Could not find a package configuration file provided by \"")
              ;
              poVar9 = std::operator<<(poVar9,(string *)&this->Name);
              poVar9 = std::operator<<(poVar9,"\"");
              poVar9 = std::operator<<(poVar9,local_4b0);
              poVar9 = std::operator<<(poVar9," with any of the following names:\n");
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_4f0,"  ",&local_4f1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_518,"",&local_519);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_540,"\n",&local_541);
              cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_4d0,&local_4f0,&this->Configs,&local_518,&local_540);
              poVar9 = std::operator<<(poVar9,(string *)&local_4d0);
              std::operator<<(poVar9,"\n");
              std::__cxx11::string::~string((string *)&local_4d0);
              std::__cxx11::string::~string((string *)&local_540);
              std::allocator<char>::~allocator((allocator<char> *)&local_541);
              std::__cxx11::string::~string((string *)&local_518);
              std::allocator<char>::~allocator((allocator<char> *)&local_519);
              std::__cxx11::string::~string((string *)&local_4f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
            }
            poVar9 = std::operator<<((ostream *)local_300,"Add the installation prefix of \"");
            poVar9 = std::operator<<(poVar9,(string *)&this->Name);
            poVar9 = std::operator<<(poVar9,"\" to CMAKE_PREFIX_PATH or set \"");
            poVar9 = std::operator<<(poVar9,(string *)&this->Variable);
            poVar9 = std::operator<<(poVar9,
                                     "\" to a directory containing one of the above files. If \"");
            poVar9 = std::operator<<(poVar9,(string *)&this->Name);
            std::operator<<(poVar9,
                            "\" provides a separate development package or SDK, be sure it has been installed."
                           );
          }
          std::__cxx11::string::~string(local_4b0);
        }
        else {
          i = cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
                        (&this->ConsideredConfigs);
          poVar9 = std::operator<<((ostream *)local_300,
                                   "Could not find a configuration file for package \"");
          poVar9 = std::operator<<(poVar9,(string *)&this->Name);
          poVar9 = std::operator<<(poVar9,"\" that ");
          pcVar7 = "is compatible with";
          if ((this->VersionExact & 1U) != 0) {
            pcVar7 = "exactly matches";
          }
          poVar9 = std::operator<<(poVar9,pcVar7);
          poVar9 = std::operator<<(poVar9," requested version \"");
          poVar9 = std::operator<<(poVar9,(string *)&this->Version);
          poVar9 = std::operator<<(poVar9,"\".\n");
          std::operator<<(poVar9,
                          "The following configuration files were considered but not accepted:\n");
          requestedVersionString.field_2._8_8_ =
               std::
               vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
               ::begin(&this->ConsideredConfigs);
          __gnu_cxx::
          __normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
          ::__normal_iterator<cmFindPackageCommand::ConfigFileInfo*>
                    ((__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
                      *)&local_488,
                     (__normal_iterator<cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                      *)((long)&requestedVersionString.field_2 + 8));
          while (bVar4 = __gnu_cxx::operator!=(&local_488,&i), bVar4) {
            poVar9 = std::operator<<((ostream *)local_300,"  ");
            pCVar12 = __gnu_cxx::
                      __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                      ::operator->(&local_488);
            poVar9 = std::operator<<(poVar9,(string *)pCVar12);
            poVar9 = std::operator<<(poVar9,", version: ");
            pCVar12 = __gnu_cxx::
                      __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
                      ::operator->(&local_488);
            poVar9 = std::operator<<(poVar9,(string *)&pCVar12->version);
            std::operator<<(poVar9,"\n");
            __gnu_cxx::
            __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
            ::operator++(&local_488);
          }
        }
      }
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      bVar4 = this->Required;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,((byte)~bVar4 & 1) * 3 + FATAL_ERROR,&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      if ((this->Required & 1U) != 0) {
        cmSystemTools::SetFatalErrorOccured();
      }
      std::__cxx11::ostringstream::str();
      bVar5 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_588);
      if (((bVar5 ^ 0xff) & 1) != 0) {
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_5a8);
        std::__cxx11::string::~string((string *)&local_5a8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&duplicate_end);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
    }
  }
  if (bVar6) {
    local_a88 = "1";
  }
  else {
    local_a88 = "0";
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,
             (string *)((long)&notFoundMessageVar.field_2 + 8),local_a88);
  std::__cxx11::string::string
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigsVar.field_2._M_local_buf + 8),"_CONFIG");
  if (bVar6) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigsVar.field_2 + 8),pcVar7);
  }
  else {
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,
               (string *)((long)&consideredConfigsVar.field_2 + 8));
  }
  std::__cxx11::string::string
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredVersionsVar.field_2._M_local_buf + 8),"_CONSIDERED_CONFIGS");
  std::__cxx11::string::string
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),(string *)&this->Name);
  std::__cxx11::string::operator+=
            ((string *)(consideredConfigFiles.field_2._M_local_buf + 8),"_CONSIDERED_VERSIONS");
  std::__cxx11::string::string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&sep);
  i_1._M_current = (ConfigFileInfo *)0xa67d2c;
  local_7f8._M_current =
       (ConfigFileInfo *)
       std::
       vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
       ::begin(&this->ConsideredConfigs);
  __gnu_cxx::
  __normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
  ::__normal_iterator<cmFindPackageCommand::ConfigFileInfo*>
            ((__normal_iterator<cmFindPackageCommand::ConfigFileInfo_const*,std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
              *)&local_7f0,&local_7f8);
  while( true ) {
    local_800._M_current =
         (ConfigFileInfo *)
         std::
         vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
         ::end(&this->ConsideredConfigs);
    bVar6 = __gnu_cxx::operator!=(&local_7f0,&local_800);
    if (!bVar6) break;
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(char *)i_1._M_current);
    std::__cxx11::string::operator+=((string *)&sep,(char *)i_1._M_current);
    pCVar12 = __gnu_cxx::
              __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
              ::operator->(&local_7f0);
    std::__cxx11::string::operator+=
              ((string *)(consideredVersions.field_2._M_local_buf + 8),(string *)pCVar12);
    pCVar12 = __gnu_cxx::
              __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
              ::operator->(&local_7f0);
    std::__cxx11::string::operator+=((string *)&sep,(string *)&pCVar12->version);
    i_1._M_current = (ConfigFileInfo *)0xa34b63;
    __gnu_cxx::
    __normal_iterator<const_cmFindPackageCommand::ConfigFileInfo_*,_std::vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>_>
    ::operator++(&local_7f0);
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredVersionsVar.field_2 + 8),pcVar7);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,(string *)((long)&consideredConfigFiles.field_2 + 8),pcVar7);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)(consideredVersions.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigFiles.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredVersionsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(consideredConfigsVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string((string *)(notFoundMessage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(notFoundMessageVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(upperFound.field_2._M_local_buf + 8));
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles) {
    if (!cmSystemTools::IsOff(def)) {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if (!cmSystemTools::FileIsFullPath(dir.c_str())) {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
      }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file)) {
        this->FileFound = file;
        fileFound = true;
      }
      def = this->Makefile->GetDefinition(this->Variable);
    }

    // Search for the config file if it is not already found.
    if (cmSystemTools::IsOff(def) || !fileFound) {
      fileFound = this->FindConfig();
    }

    // Sanity check.
    if (fileFound && this->FileFound.empty()) {
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR, "fileFound is true but FileFound is empty!");
      fileFound = false;
    }
  }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if (fileFound) {
    if (this->Makefile->IsDefinitionSet(foundVar) &&
        !this->Makefile->IsOn(foundVar)) {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
    }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if (this->ReadListFile(this->FileFound.c_str(), DoPolicyScope)) {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage =
          this->Makefile->GetSafeDefinition(notFoundMessageVar);
      }
    } else {
      // The configuration file is invalid.
      result = false;
    }
  }

  // package not found
  if (result && !found) {
    // warn if package required or neither quiet nor in config mode
    if (this->Required ||
        !(this->Quiet || (this->UseConfigFiles && !this->UseFindModules &&
                          this->ConsideredConfigs.empty()))) {
      // The variable is not set.
      std::ostringstream e;
      std::ostringstream aw;
      if (configFileSetFOUNDFalse) {
        /* clang-format off */
        e << "Found package configuration file:\n"
          "  " << this->FileFound << "\n"
          "but it set " << foundVar << " to FALSE so package \"" <<
          this->Name << "\" is considered to be NOT FOUND.";
        /* clang-format on */
        if (!notFoundMessage.empty()) {
          e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
      // If there are files in ConsideredConfigs, it means that FooConfig.cmake
      // have been found, but they didn't have appropriate versions.
      else if (!this->ConsideredConfigs.empty()) {
        std::vector<ConfigFileInfo>::const_iterator duplicate_end =
          cmRemoveDuplicates(this->ConsideredConfigs);
        e << "Could not find a configuration file for package \"" << this->Name
          << "\" that "
          << (this->VersionExact ? "exactly matches" : "is compatible with")
          << " requested version \"" << this->Version << "\".\n"
          << "The following configuration files were considered but not "
             "accepted:\n";
        for (std::vector<ConfigFileInfo>::const_iterator i =
               this->ConsideredConfigs.begin();
             i != duplicate_end; ++i) {
          e << "  " << i->filename << ", version: " << i->version << "\n";
        }
      } else {
        std::string requestedVersionString;
        if (!this->Version.empty()) {
          requestedVersionString = " (requested version ";
          requestedVersionString += this->Version;
          requestedVersionString += ")";
        }

        if (this->UseConfigFiles) {
          if (this->UseFindModules) {
            e << "By not providing \"Find" << this->Name
              << ".cmake\" in "
                 "CMAKE_MODULE_PATH this project has asked CMake to find a "
                 "package configuration file provided by \""
              << this->Name << "\", "
                               "but CMake did not find one.\n";
          }

          if (this->Configs.size() == 1) {
            e << "Could not find a package configuration file named \""
              << this->Configs[0] << "\" provided by package \"" << this->Name
              << "\"" << requestedVersionString << ".\n";
          } else {
            e << "Could not find a package configuration file provided by \""
              << this->Name << "\"" << requestedVersionString
              << " with any of the following names:\n"
              << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

          e << "Add the installation prefix of \"" << this->Name
            << "\" to "
               "CMAKE_PREFIX_PATH or set \""
            << this->Variable
            << "\" to a "
               "directory containing one of the above files. "
               "If \""
            << this->Name << "\" provides a separate development "
                             "package or SDK, be sure it has been installed.";
        } else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
          e << "No \"Find" << this->Name << ".cmake\" found in "
            << "CMAKE_MODULE_PATH.";

          aw
            << "Find" << this->Name
            << ".cmake must either be part of this "
               "project itself, in this case adjust CMAKE_MODULE_PATH so that "
               "it points to the correct location inside its source tree.\n"
               "Or it must be installed by a package which has already been "
               "found via find_package().  In this case make sure that "
               "package has indeed been found and adjust CMAKE_MODULE_PATH to "
               "contain the location where that package has installed "
               "Find"
            << this->Name
            << ".cmake.  This must be a location "
               "provided by that package.  This error in general means that "
               "the buildsystem of this project is relying on a Find-module "
               "without ensuring that it is actually available.\n";
        }
      }

      this->Makefile->IssueMessage(
        this->Required ? cmake::FATAL_ERROR : cmake::WARNING, e.str());
      if (this->Required) {
        cmSystemTools::SetFatalErrorOccured();
      }

      if (!aw.str().empty()) {
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, aw.str());
      }
    }
    // output result if in config mode but not in quiet mode
    else if (!this->Quiet) {
      std::ostringstream aw;
      aw << "Could NOT find " << this->Name << " (missing: " << this->Name
         << "_DIR)";
      this->Makefile->DisplayStatus(aw.str().c_str(), -1);
    }
  }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found ? "1" : "0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if (found) {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
  } else {
    this->Makefile->RemoveDefinition(fileVar);
  }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for (std::vector<ConfigFileInfo>::const_iterator i =
         this->ConsideredConfigs.begin();
       i != this->ConsideredConfigs.end(); ++i) {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += i->filename;
    consideredVersions += i->version;
    sep = ";";
  }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}